

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void MetricsHelpMarker(char *desc)

{
  bool bVar1;
  
  ImGui::TextDisabled("(?)");
  bVar1 = ImGui::IsItemHovered(0x1000);
  if (bVar1) {
    ImGui::BeginTooltip();
    ImGui::PushTextWrapPos(GImGui->FontSize * 35.0);
    ImGui::TextUnformatted(desc,(char *)0x0);
    ImGui::PopTextWrapPos();
    ImGui::End();
    return;
  }
  return;
}

Assistant:

static void MetricsHelpMarker(const char* desc)
{
    ImGui::TextDisabled("(?)");
    if (ImGui::IsItemHovered(ImGuiHoveredFlags_DelayShort))
    {
        ImGui::BeginTooltip();
        ImGui::PushTextWrapPos(ImGui::GetFontSize() * 35.0f);
        ImGui::TextUnformatted(desc);
        ImGui::PopTextWrapPos();
        ImGui::EndTooltip();
    }
}